

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

bool __thiscall
glcts::anon_unknown_0::SACSubcaseBase::CheckMaxValue(SACSubcaseBase *this,GLenum e,GLint expected)

{
  char *pcVar1;
  GLboolean local_2d;
  float local_2c;
  GLboolean b;
  ulong uStack_28;
  GLfloat f;
  GLint64 i64;
  GLint i;
  GLenum GStack_14;
  bool ok;
  GLint expected_local;
  GLenum e_local;
  SACSubcaseBase *this_local;
  
  i64._7_1_ = 1;
  i = expected;
  GStack_14 = e;
  _expected_local = this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,e,(GLint *)&i64);
  pcVar1 = GLenumToString(this,GStack_14);
  anon_unknown_0::Output("%s = %d\n",pcVar1,(ulong)(uint)i64);
  if ((int)(uint)i64 < i) {
    i64._7_1_ = 0;
    pcVar1 = GLenumToString(this,GStack_14);
    anon_unknown_0::Output
              ("%s state is incorrect (GetIntegerv, is: %d, expected: %d)\n",pcVar1,(ulong)(uint)i64
               ,(ulong)(uint)i);
  }
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GStack_14,
             (GLint64 *)&stack0xffffffffffffffd8);
  if ((long)uStack_28 < (long)i) {
    i64._7_1_ = 0;
    pcVar1 = GLenumToString(this,GStack_14);
    anon_unknown_0::Output
              ("%s state is incorrect (GetInteger64v, is: %d, expected: %d)\n",pcVar1,
               uStack_28 & 0xffffffff,(ulong)(uint)i);
  }
  glu::CallLogWrapper::glGetFloatv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GStack_14,&local_2c);
  if (local_2c < (float)i) {
    i64._7_1_ = 0;
    pcVar1 = GLenumToString(this,GStack_14);
    anon_unknown_0::Output
              ("%s state is incorrect (GetFloatv, is: %f, expected: %d)\n",(double)local_2c,pcVar1,
               (ulong)(uint)i);
  }
  glu::CallLogWrapper::glGetBooleanv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GStack_14,&local_2d);
  return (bool)(i64._7_1_ & 1);
}

Assistant:

bool CheckMaxValue(GLenum e, GLint expected)
	{
		bool ok = true;

		GLint i;
		glGetIntegerv(e, &i);
		Output("%s = %d\n", GLenumToString(e), i);
		if (i < expected)
		{
			ok = false;
			Output("%s state is incorrect (GetIntegerv, is: %d, expected: %d)\n", GLenumToString(e), i, expected);
		}

		GLint64 i64;
		glGetInteger64v(e, &i64);
		if (i64 < static_cast<GLint64>(expected))
		{
			ok = false;
			Output("%s state is incorrect (GetInteger64v, is: %d, expected: %d)\n", GLenumToString(e),
				   static_cast<GLint>(i64), expected);
		}

		GLfloat f;
		glGetFloatv(e, &f);
		if (f < static_cast<GLfloat>(expected))
		{
			ok = false;
			Output("%s state is incorrect (GetFloatv, is: %f, expected: %d)\n", GLenumToString(e), f, expected);
		}

		GLboolean b;
		glGetBooleanv(e, &b);

		return ok;
	}